

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *param_1)

{
  float fVar1;
  ImVec2 padding;
  ImRect r_screen;
  float local_34;
  float local_2c;
  ImVec2 local_28;
  ImVec2 local_20;
  ImRect local_10;
  
  local_20 = (GImGui->Style).DisplaySafeAreaPadding;
  local_10 = GetViewportRect();
  fVar1 = ImRect::GetWidth(&local_10);
  if (fVar1 <= local_20.x * 2.0) {
    local_2c = 0.0;
  }
  else {
    local_2c = -local_20.x;
  }
  fVar1 = ImRect::GetHeight(&local_10);
  if (fVar1 <= local_20.y * 2.0) {
    local_34 = 0.0;
  }
  else {
    local_34 = -local_20.y;
  }
  ImVec2::ImVec2(&local_28,local_2c,local_34);
  ImRect::Expand(&local_10,&local_28);
  return local_10;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow*)
{
    ImVec2 padding = GImGui->Style.DisplaySafeAreaPadding;
    ImRect r_screen = GetViewportRect();
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}